

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmp.cxx
# Opt level: O0

void __thiscall vigra::BmpDecoder::~BmpDecoder(BmpDecoder *this)

{
  BmpDecoder *in_RDI;
  
  ~BmpDecoder(in_RDI);
  operator_delete(in_RDI);
  return;
}

Assistant:

BmpDecoder::~BmpDecoder()
{
    delete pimpl;
}